

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O0

type jsoncons::binary::
     native_to_little<unsigned_int,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
               (uint val,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __value;
  uint8_t item;
  uint8_t *__end0;
  uint8_t *__begin0;
  uint8_t (*__range2) [4];
  uint8_t buf [4];
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  undefined1 *local_20;
  undefined1 local_10 [4];
  undefined1 local_c [4];
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_8;
  
  for (local_20 = local_10; local_20 != local_c; local_20 = local_20 + 1) {
    uVar1 = *local_20;
    __value = std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator++(&local_8,0);
    std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    operator*((back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              &stack0xffffffffffffffc8);
    std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    operator=((back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              CONCAT17(uVar1,in_stack_ffffffffffffffd0),(value_type_conflict *)__value.container);
  }
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_little(T val, OutputIt d_first)
    {
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }